

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form2_IsEqual(IsEqualForm2 IsEqual)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  initializer_list<PenguinV_Image::ImageTemplate<unsigned_char>_> __l;
  byte bVar4;
  const_reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  code *in_RDI;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_fffffffffffffdbc;
  uint8_t in_stack_fffffffffffffdc6;
  uint8_t in_stack_fffffffffffffdc7;
  uint32_t in_stack_fffffffffffffdc8;
  uint32_t in_stack_fffffffffffffdcc;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffdd0;
  Image *in_stack_fffffffffffffdd8;
  uint32_t in_stack_fffffffffffffde4;
  uint32_t in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  size_type in_stack_fffffffffffffe00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  uint32_t *in_stack_fffffffffffffe20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint32_t *in_stack_fffffffffffffe28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe30;
  size_type __n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  value_type vVar9;
  undefined4 in_stack_fffffffffffffe44;
  value_type vVar10;
  undefined1 **local_178;
  undefined4 local_148;
  undefined4 local_144;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_140;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_128;
  undefined1 local_109;
  undefined8 *local_a8;
  undefined1 *local_a0 [5];
  undefined1 local_78 [40];
  undefined8 *local_50;
  undefined8 local_48;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  code *local_10;
  
  local_10 = in_RDI;
  Unit_Test::intensityArray(in_stack_fffffffffffffdbc);
  local_109 = 1;
  local_a8 = local_a0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,
             in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc6);
  Test_Helper::uniformImage
            ((uint8_t)((uint)in_stack_fffffffffffffdec >> 0x18),in_stack_fffffffffffffde8,
             in_stack_fffffffffffffde4,in_stack_fffffffffffffdd8);
  local_a8 = (undefined8 *)local_78;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,1);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,
             in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc6);
  Test_Helper::uniformImage
            ((uint8_t)((uint)in_stack_fffffffffffffdec >> 0x18),in_stack_fffffffffffffde8,
             in_stack_fffffffffffffde4,in_stack_fffffffffffffdd8);
  local_109 = 0;
  local_50 = local_a0;
  local_48 = 2;
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x1d9656);
  __l._M_array._7_1_ = in_stack_fffffffffffffdff;
  __l._M_array._0_7_ = in_stack_fffffffffffffdf8;
  __l._M_len = in_stack_fffffffffffffe00;
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector(in_stack_fffffffffffffdf0,__l,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::~allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x1d968a);
  local_178 = (undefined1 **)&local_50;
  do {
    local_178 = local_178 + -5;
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x1d96bf);
  } while (local_178 != local_a0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d96e9);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d96f6);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d970b);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d9720);
  Unit_Test::generateRoi
            ((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
             in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             in_stack_fffffffffffffe20);
  this = &local_28;
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,0);
  vVar1 = *pvVar5;
  __n = 1;
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,1);
  vVar2 = *pvVar5;
  pvVar6 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](&local_40,0);
  this_00 = &local_128;
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,0);
  vVar9 = *pvVar7;
  this_01 = &local_140;
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,0);
  vVar10 = *pvVar7;
  pvVar8 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](&local_40,__n);
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,__n);
  vVar3 = *pvVar7;
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,__n);
  bVar4 = (*local_10)(pvVar6,vVar9,vVar10,pvVar8,vVar3,*pvVar7,local_144,local_148);
  bVar4 = (vVar1 == vVar2) == (bool)(bVar4 & 1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffdd0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffdd0);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)in_stack_fffffffffffffdd0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdd0);
  return (bool)(bVar4 & 1);
}

Assistant:

bool form2_IsEqual(IsEqualForm2 IsEqual)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        std::vector < PenguinV_Image::Image > image = { uniformImage( intensity[0] ), uniformImage( intensity[1] ) };

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( image, roiX, roiY, roiWidth, roiHeight );

        return (intensity[0] == intensity[1]) ==
            (IsEqual( image[0], roiX[0], roiY[0], image[1], roiX[1], roiY[1], roiWidth, roiHeight ));
    }